

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtld_local.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  long lVar2;
  code *UNRECOVERED_JUMPTABLE;
  
  lVar2 = dlopen("./librtld_local.so",2);
  if (lVar2 == 0) {
    __assert_fail("lib",
                  "/workspace/llm4binary/github/license_c_cmakelists/apitrace[P]apitrace-tests/apps/egl/gles2/rtld_local.cpp"
                  ,0x28,"int main(int, char **)");
  }
  UNRECOVERED_JUMPTABLE = (code *)dlsym(lVar2,"test");
  if (UNRECOVERED_JUMPTABLE != (code *)0x0) {
    iVar1 = (*UNRECOVERED_JUMPTABLE)(argc,argv);
    return iVar1;
  }
  __assert_fail("test",
                "/workspace/llm4binary/github/license_c_cmakelists/apitrace[P]apitrace-tests/apps/egl/gles2/rtld_local.cpp"
                ,0x2a,"int main(int, char **)");
}

Assistant:

int
main(int argc, char *argv[])
{
    void *lib = dlopen("./librtld_local.so", RTLD_LOCAL | RTLD_NOW);
    assert(lib);
    TEST test = (TEST)dlsym(lib, "test");
    assert(test);
    return test(argc, argv);
}